

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeSIMDLoadStoreLane<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,SIMDLoadStoreLaneOp op,int bytes)

{
  SIMDLoadStoreLaneOp SVar1;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *pvVar2;
  Index IVar3;
  ParseDeclsCtx *pPVar4;
  bool bVar5;
  Err *pEVar6;
  Ok *pOVar7;
  uchar *puVar8;
  _Optional_payload_base<unsigned_char> local_11a;
  undefined1 local_118 [6];
  optional<unsigned_char> lane;
  Err *err;
  Result<wasm::Ok> _val;
  Result<wasm::Ok> arg;
  undefined1 local_90 [8];
  MaybeResult<wasm::Ok> mem;
  anon_class_48_6_2b818c79 retry;
  size_t reset;
  int bytes_local;
  SIMDLoadStoreLaneOp op_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDeclsCtx *pPStack_18;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  reset._0_4_ = bytes;
  reset._4_4_ = op;
  _bytes_local = annotations;
  annotations_local._4_4_ = pos;
  pPStack_18 = ctx;
  ctx_local = (ParseDeclsCtx *)__return_storage_ptr__;
  retry.op = (SIMDLoadStoreLaneOp *)Lexer::getPos(&ctx->in);
  mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ = pPStack_18;
  retry.ctx = (ParseDeclsCtx *)&retry.op;
  retry.reset = &reset;
  retry.bytes = (int *)((long)&annotations_local + 4);
  retry.pos = (Index *)_bytes_local;
  retry.annotations =
       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
       ((long)&reset + 4);
  maybeMemidx<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_90,pPStack_18);
  pEVar6 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)local_90);
  if (pEVar6 == (Err *)0x0) {
    memarg<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pPStack_18,
               (uint32_t)reset);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err,
               (Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    pEVar6 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
    if (pEVar6 != (Err *)0x0) {
      wasm::Err::Err((Err *)local_118,pEVar6);
      Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)local_118);
      wasm::Err::~Err((Err *)local_118);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
    if (pEVar6 == (Err *)0x0) {
      local_11a = (_Optional_payload_base<unsigned_char>)Lexer::takeU8(&pPStack_18->in);
      bVar5 = std::optional::operator_cast_to_bool((optional *)&local_11a);
      pPVar4 = pPStack_18;
      IVar3 = annotations_local._4_4_;
      pvVar2 = _bytes_local;
      SVar1 = reset._4_4_;
      if (bVar5) {
        pOVar7 = MaybeResult<wasm::Ok>::getPtr((MaybeResult<wasm::Ok> *)local_90);
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        puVar8 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)&local_11a);
        NullInstrParserCtx::makeSIMDLoadStoreLane
                  (__return_storage_ptr__,(NullInstrParserCtx *)pPVar4,IVar3,pvVar2,SVar1,pOVar7,
                   *puVar8);
      }
      else {
        makeSIMDLoadStoreLane<wasm::WATParser::ParseDeclsCtx>::anon_class_48_6_2b818c79::operator()
                  (__return_storage_ptr__,
                   (anon_class_48_6_2b818c79 *)
                   ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      }
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    makeSIMDLoadStoreLane<wasm::WATParser::ParseDeclsCtx>::anon_class_48_6_2b818c79::operator()
              (__return_storage_ptr__,
               (anon_class_48_6_2b818c79 *)
               ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDLoadStoreLane(Ctx& ctx,
                               Index pos,
                               const std::vector<Annotation>& annotations,
                               SIMDLoadStoreLaneOp op,
                               int bytes) {
  auto reset = ctx.in.getPos();

  auto retry = [&]() -> Result<> {
    // We failed to parse. Maybe the lane index was accidentally parsed as the
    // optional memory index. Try again without parsing a memory index.
    WithPosition with(ctx, reset);
    auto arg = memarg(ctx, bytes);
    CHECK_ERR(arg);
    auto lane = ctx.in.takeU8();
    if (!lane) {
      return ctx.in.err("expected lane index");
    }
    return ctx.makeSIMDLoadStoreLane(
      pos, annotations, op, nullptr, *arg, *lane);
  };

  auto mem = maybeMemidx(ctx);
  if (mem.getErr()) {
    return retry();
  }
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  auto lane = ctx.in.takeU8();
  if (!lane) {
    return retry();
  }
  return ctx.makeSIMDLoadStoreLane(
    pos, annotations, op, mem.getPtr(), *arg, *lane);
}